

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::rotate(btSoftBody *this,btQuaternion *rot)

{
  btTransform t;
  btTransform local_50;
  
  local_50.m_basis.m_el[0].m_floats[0] = 1.0;
  local_50.m_basis.m_el[0].m_floats[1] = 0.0;
  local_50.m_basis.m_el[0].m_floats[2] = 0.0;
  local_50.m_basis.m_el[0].m_floats[3] = 0.0;
  local_50.m_basis.m_el[1].m_floats[0] = 0.0;
  local_50.m_basis.m_el[1].m_floats[1] = 1.0;
  local_50.m_basis.m_el[1].m_floats[2] = 0.0;
  local_50.m_basis.m_el[1].m_floats[3] = 0.0;
  local_50.m_basis.m_el[2].m_floats[0] = 0.0;
  local_50.m_basis.m_el[2].m_floats[1] = 0.0;
  local_50.m_basis.m_el[2].m_floats[2] = 1.0;
  local_50.m_basis.m_el[2].m_floats[3] = 0.0;
  local_50.m_origin.m_floats[0] = 0.0;
  local_50.m_origin.m_floats[1] = 0.0;
  local_50.m_origin.m_floats[2] = 0.0;
  local_50.m_origin.m_floats[3] = 0.0;
  btMatrix3x3::setRotation(&local_50.m_basis,rot);
  transform(this,&local_50);
  return;
}

Assistant:

void			btSoftBody::rotate(	const btQuaternion& rot)
{
	btTransform	t;
	t.setIdentity();
	t.setRotation(rot);
	transform(t);
}